

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest10::iterate(NegativeTest10 *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  GLuint *out_tc_id;
  NotSupportedError *this_01;
  char *description;
  GLuint *out_fs_id;
  GLuint *out_te_id;
  GLuint *out_gs_id;
  pointer p_Var3;
  allocator<char> local_1d9;
  GLuint *local_1d8;
  GLuint *local_1d0;
  GLuint *local_1c8;
  GLuint *local_1c0;
  Functions *local_1b8;
  undefined1 local_1b0 [384];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b8 = (Functions *)CONCAT44(extraout_var,iVar2);
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar1) {
    initTestCases(this);
    local_1c0 = &this->m_vs_id;
    local_1c8 = &this->m_tc_id;
    local_1d0 = &this->m_te_id;
    local_1d8 = &this->m_gs_id;
    this_00 = (ostringstream *)(local_1b0 + 8);
    for (p_Var3 = (this->m_test_cases).
                  super__Vector_base<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        p_Var3 != (this->m_test_cases).
                  super__Vector_base<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>
                  ._M_impl.super__Vector_impl_data._M_finish; p_Var3 = p_Var3 + 1) {
      local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
      out_tc_id = (GLuint *)(p_Var3->tc_body)._M_string_length;
      if (out_tc_id != (GLuint *)0x0) {
        out_tc_id = local_1c8;
      }
      out_te_id = (GLuint *)(p_Var3->te_body)._M_string_length;
      if (out_te_id != (GLuint *)0x0) {
        out_te_id = local_1d0;
      }
      out_gs_id = (GLuint *)(p_Var3->gs_body)._M_string_length;
      if (out_gs_id != (GLuint *)0x0) {
        out_gs_id = local_1d8;
      }
      out_fs_id = (GLuint *)(p_Var3->fs_body)._M_string_length;
      if (out_fs_id != (GLuint *)0x0) {
        out_fs_id = &this->m_fs_id;
      }
      bVar1 = Utils::buildProgram(local_1b8,&p_Var3->vs_body,&p_Var3->tc_body,&p_Var3->te_body,
                                  &p_Var3->gs_body,&p_Var3->fs_body,(GLchar **)0x0,(uint *)local_1b0
                                  ,local_1c0,out_tc_id,out_te_id,out_gs_id,out_fs_id,&this->m_po_id)
      ;
      if (bVar1) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"A program object was successfully built for [");
        std::operator<<((ostream *)this_00,(string *)p_Var3);
        std::operator<<((ostream *)this_00,"] test case, even though it was invalid.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        this->m_has_test_passed = false;
      }
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])(this);
    }
    bVar1 = this->m_has_test_passed == false;
    if (bVar1) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar1,
               description);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"GL_ARB_shader_subroutine is not supported.",&local_1d9);
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b0);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult NegativeTest10::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Form test cases */
	initTestCases();

	/* Iterate over all test cases */
	for (_test_cases_const_iterator test_case_iterator = m_test_cases.begin(); test_case_iterator != m_test_cases.end();
		 ++test_case_iterator)
	{
		const _test_case& test_case = *test_case_iterator;

		/* Try to build the program object */
		if (ShaderSubroutine::Utils::buildProgram(gl, test_case.vs_body, test_case.tc_body, test_case.te_body,
												  test_case.gs_body, test_case.fs_body, DE_NULL, /* xfb_varyings */
												  0,											 /* n_xfb_varyings */
												  &m_vs_id, (test_case.tc_body.length() > 0) ? &m_tc_id : DE_NULL,
												  (test_case.te_body.length() > 0) ? &m_te_id : DE_NULL,
												  (test_case.gs_body.length() > 0) ? &m_gs_id : DE_NULL,
												  (test_case.fs_body.length() > 0) ? &m_fs_id : DE_NULL, &m_po_id))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "A program object was successfully built for ["
							   << test_case.name << "] test case, even though it was invalid."
							   << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		/* Delete any objects that may have been created */
		deinit();
	} /* for (all test cases) */

	/** All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}